

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O0

void __thiscall RTIMU::handleGyroBias(RTIMU *this)

{
  float fVar1;
  float fVar2;
  RTIMUSettings *pRVar3;
  RTFLOAT RVar4;
  RTFLOAT RVar5;
  undefined1 local_9c [8];
  RTVector3 deltaAccel;
  RTIMU_DATA tempIMU;
  float *matrix;
  RTIMU *this_local;
  
  if ((0 < this->m_settings->m_axisRotation) && (this->m_settings->m_axisRotation < 0x18)) {
    tempIMU._112_8_ = m_axisRotation + this->m_settings->m_axisRotation;
    memcpy(deltaAccel.m_data + 1,&this->m_imuData,0x78);
    if ((*(float *)tempIMU._112_8_ != 0.0) || (NAN(*(float *)tempIMU._112_8_))) {
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setX(&(this->m_imuData).gyro,RVar4 * *(float *)tempIMU._112_8_);
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setX(&(this->m_imuData).accel,RVar4 * *(float *)tempIMU._112_8_);
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setX(&(this->m_imuData).compass,RVar4 * *(float *)tempIMU._112_8_);
    }
    else if ((*(float *)(tempIMU._112_8_ + 4) != 0.0) || (NAN(*(float *)(tempIMU._112_8_ + 4)))) {
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setX(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 4));
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setX(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 4));
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setX(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 4));
    }
    else if ((*(float *)(tempIMU._112_8_ + 8) != 0.0) || (NAN(*(float *)(tempIMU._112_8_ + 8)))) {
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setX(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 8));
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setX(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 8));
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setX(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 8));
    }
    if ((*(float *)(tempIMU._112_8_ + 0xc) != 0.0) || (NAN(*(float *)(tempIMU._112_8_ + 0xc)))) {
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setY(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 0xc));
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setY(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 0xc));
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setY(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 0xc));
    }
    else if ((*(float *)(tempIMU._112_8_ + 0x10) != 0.0) ||
            (NAN(*(float *)(tempIMU._112_8_ + 0x10)))) {
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setY(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 0x10));
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setY(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 0x10));
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setY(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 0x10));
    }
    else if ((*(float *)(tempIMU._112_8_ + 0x14) != 0.0) ||
            (NAN(*(float *)(tempIMU._112_8_ + 0x14)))) {
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setY(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 0x14));
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setY(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 0x14));
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setY(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 0x14));
    }
    if ((*(float *)(tempIMU._112_8_ + 0x18) != 0.0) || (NAN(*(float *)(tempIMU._112_8_ + 0x18)))) {
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setZ(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 0x18));
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setZ(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 0x18));
      RVar4 = RTVector3::x((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setZ(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 0x18));
    }
    else if ((*(float *)(tempIMU._112_8_ + 0x1c) != 0.0) ||
            (NAN(*(float *)(tempIMU._112_8_ + 0x1c)))) {
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setZ(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 0x1c));
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setZ(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 0x1c));
      RVar4 = RTVector3::y((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setZ(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 0x1c));
    }
    else if ((*(float *)(tempIMU._112_8_ + 0x20) != 0.0) ||
            (NAN(*(float *)(tempIMU._112_8_ + 0x20)))) {
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.fusionQPose.m_data + 3));
      RTVector3::setZ(&(this->m_imuData).gyro,RVar4 * *(float *)(tempIMU._112_8_ + 0x20));
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.gyro.m_data + 2));
      RTVector3::setZ(&(this->m_imuData).accel,RVar4 * *(float *)(tempIMU._112_8_ + 0x20));
      RVar4 = RTVector3::z((RTVector3 *)(tempIMU.accel.m_data + 2));
      RTVector3::setZ(&(this->m_imuData).compass,RVar4 * *(float *)(tempIMU._112_8_ + 0x20));
    }
  }
  local_9c = *(undefined1 (*) [8])(this->m_previousAccel).m_data;
  deltaAccel.m_data[0] = (this->m_previousAccel).m_data[2];
  RTVector3::operator-=((RTVector3 *)local_9c,&(this->m_imuData).accel);
  RTVector3::operator=(&this->m_previousAccel,&(this->m_imuData).accel);
  RVar4 = RTVector3::length((RTVector3 *)local_9c);
  if ((RVar4 < 0.05) && (RVar4 = RTVector3::length(&(this->m_imuData).gyro), RVar4 < 0.2)) {
    if (SBORROW4(this->m_gyroSampleCount,this->m_sampleRate * 5) ==
        this->m_gyroSampleCount + this->m_sampleRate * -5 < 0) {
      pRVar3 = this->m_settings;
      fVar1 = this->m_gyroContinuousAlpha;
      RVar4 = RTVector3::x(&this->m_settings->m_gyroBias);
      fVar2 = this->m_gyroContinuousAlpha;
      RVar5 = RTVector3::x(&(this->m_imuData).gyro);
      RTVector3::setX(&pRVar3->m_gyroBias,(1.0 - fVar1) * RVar4 + fVar2 * RVar5);
      pRVar3 = this->m_settings;
      fVar1 = this->m_gyroContinuousAlpha;
      RVar4 = RTVector3::y(&this->m_settings->m_gyroBias);
      fVar2 = this->m_gyroContinuousAlpha;
      RVar5 = RTVector3::y(&(this->m_imuData).gyro);
      RTVector3::setY(&pRVar3->m_gyroBias,(1.0 - fVar1) * RVar4 + fVar2 * RVar5);
      pRVar3 = this->m_settings;
      fVar1 = this->m_gyroContinuousAlpha;
      RVar4 = RTVector3::z(&this->m_settings->m_gyroBias);
      fVar2 = this->m_gyroContinuousAlpha;
      RVar5 = RTVector3::z(&(this->m_imuData).gyro);
      RTVector3::setZ(&pRVar3->m_gyroBias,(1.0 - fVar1) * RVar4 + fVar2 * RVar5);
    }
    else {
      pRVar3 = this->m_settings;
      fVar1 = this->m_gyroLearningAlpha;
      RVar4 = RTVector3::x(&this->m_settings->m_gyroBias);
      fVar2 = this->m_gyroLearningAlpha;
      RVar5 = RTVector3::x(&(this->m_imuData).gyro);
      RTVector3::setX(&pRVar3->m_gyroBias,(1.0 - fVar1) * RVar4 + fVar2 * RVar5);
      pRVar3 = this->m_settings;
      fVar1 = this->m_gyroLearningAlpha;
      RVar4 = RTVector3::y(&this->m_settings->m_gyroBias);
      fVar2 = this->m_gyroLearningAlpha;
      RVar5 = RTVector3::y(&(this->m_imuData).gyro);
      RTVector3::setY(&pRVar3->m_gyroBias,(1.0 - fVar1) * RVar4 + fVar2 * RVar5);
      pRVar3 = this->m_settings;
      fVar1 = this->m_gyroLearningAlpha;
      RVar4 = RTVector3::z(&this->m_settings->m_gyroBias);
      fVar2 = this->m_gyroLearningAlpha;
      RVar5 = RTVector3::z(&(this->m_imuData).gyro);
      RTVector3::setZ(&pRVar3->m_gyroBias,(1.0 - fVar1) * RVar4 + fVar2 * RVar5);
      this->m_gyroSampleCount = this->m_gyroSampleCount + 1;
      if (this->m_gyroSampleCount == this->m_sampleRate * 5) {
        this->m_settings->m_gyroBiasValid = true;
        (*(this->m_settings->super_RTIMUHal)._vptr_RTIMUHal[3])();
      }
    }
  }
  RTVector3::operator-=(&(this->m_imuData).gyro,&this->m_settings->m_gyroBias);
  return;
}

Assistant:

void RTIMU::handleGyroBias()
{
    // do axis rotation

    if ((m_settings->m_axisRotation > 0) && (m_settings->m_axisRotation < RTIMU_AXIS_ROTATION_COUNT)) {
        // need to do an axis rotation
        float *matrix = m_axisRotation[m_settings->m_axisRotation];
        RTIMU_DATA tempIMU = m_imuData;

        // do new x value
        if (matrix[0] != 0) {
            m_imuData.gyro.setX(tempIMU.gyro.x() * matrix[0]);
            m_imuData.accel.setX(tempIMU.accel.x() * matrix[0]);
            m_imuData.compass.setX(tempIMU.compass.x() * matrix[0]);
        } else if (matrix[1] != 0) {
            m_imuData.gyro.setX(tempIMU.gyro.y() * matrix[1]);
            m_imuData.accel.setX(tempIMU.accel.y() * matrix[1]);
            m_imuData.compass.setX(tempIMU.compass.y() * matrix[1]);
        } else if (matrix[2] != 0) {
            m_imuData.gyro.setX(tempIMU.gyro.z() * matrix[2]);
            m_imuData.accel.setX(tempIMU.accel.z() * matrix[2]);
            m_imuData.compass.setX(tempIMU.compass.z() * matrix[2]);
        }

        // do new y value
        if (matrix[3] != 0) {
            m_imuData.gyro.setY(tempIMU.gyro.x() * matrix[3]);
            m_imuData.accel.setY(tempIMU.accel.x() * matrix[3]);
            m_imuData.compass.setY(tempIMU.compass.x() * matrix[3]);
        } else if (matrix[4] != 0) {
            m_imuData.gyro.setY(tempIMU.gyro.y() * matrix[4]);
            m_imuData.accel.setY(tempIMU.accel.y() * matrix[4]);
            m_imuData.compass.setY(tempIMU.compass.y() * matrix[4]);
        } else if (matrix[5] != 0) {
            m_imuData.gyro.setY(tempIMU.gyro.z() * matrix[5]);
            m_imuData.accel.setY(tempIMU.accel.z() * matrix[5]);
            m_imuData.compass.setY(tempIMU.compass.z() * matrix[5]);
        }

        // do new z value
        if (matrix[6] != 0) {
            m_imuData.gyro.setZ(tempIMU.gyro.x() * matrix[6]);
            m_imuData.accel.setZ(tempIMU.accel.x() * matrix[6]);
            m_imuData.compass.setZ(tempIMU.compass.x() * matrix[6]);
        } else if (matrix[7] != 0) {
            m_imuData.gyro.setZ(tempIMU.gyro.y() * matrix[7]);
            m_imuData.accel.setZ(tempIMU.accel.y() * matrix[7]);
            m_imuData.compass.setZ(tempIMU.compass.y() * matrix[7]);
        } else if (matrix[8] != 0) {
            m_imuData.gyro.setZ(tempIMU.gyro.z() * matrix[8]);
            m_imuData.accel.setZ(tempIMU.accel.z() * matrix[8]);
            m_imuData.compass.setZ(tempIMU.compass.z() * matrix[8]);
        }
    }

    RTVector3 deltaAccel = m_previousAccel;
    deltaAccel -= m_imuData.accel;   // compute difference
    m_previousAccel = m_imuData.accel;

    if ((deltaAccel.length() < RTIMU_FUZZY_ACCEL_ZERO) && (m_imuData.gyro.length() < RTIMU_FUZZY_GYRO_ZERO)) {
        // what we are seeing on the gyros should be bias only so learn from this

        if (m_gyroSampleCount < (5 * m_sampleRate)) {
            m_settings->m_gyroBias.setX((1.0 - m_gyroLearningAlpha) * m_settings->m_gyroBias.x() + m_gyroLearningAlpha * m_imuData.gyro.x());
            m_settings->m_gyroBias.setY((1.0 - m_gyroLearningAlpha) * m_settings->m_gyroBias.y() + m_gyroLearningAlpha * m_imuData.gyro.y());
            m_settings->m_gyroBias.setZ((1.0 - m_gyroLearningAlpha) * m_settings->m_gyroBias.z() + m_gyroLearningAlpha * m_imuData.gyro.z());

            m_gyroSampleCount++;

            if (m_gyroSampleCount == (5 * m_sampleRate)) {
                // this could have been true already of course
                m_settings->m_gyroBiasValid = true;
                m_settings->saveSettings();
            }
        } else {
            m_settings->m_gyroBias.setX((1.0 - m_gyroContinuousAlpha) * m_settings->m_gyroBias.x() + m_gyroContinuousAlpha * m_imuData.gyro.x());
            m_settings->m_gyroBias.setY((1.0 - m_gyroContinuousAlpha) * m_settings->m_gyroBias.y() + m_gyroContinuousAlpha * m_imuData.gyro.y());
            m_settings->m_gyroBias.setZ((1.0 - m_gyroContinuousAlpha) * m_settings->m_gyroBias.z() + m_gyroContinuousAlpha * m_imuData.gyro.z());
        }
    }

    m_imuData.gyro -= m_settings->m_gyroBias;
}